

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O2

void enumStringListCallback(void *data,char *str)

{
  uint uVar1;
  _func_void_ptr_PHYSFS_uint64 *p_Var2;
  void *pvVar3;
  size_t sVar4;
  char *__dest;
  
  if (*(int *)((long)data + 0xc) != 0) {
    return;
  }
  pvVar3 = (*__PHYSFS_AllocatorHooks.Realloc)(*data,(ulong)(*(int *)((long)data + 8) + 2) << 3);
  p_Var2 = __PHYSFS_AllocatorHooks.Malloc;
  sVar4 = strlen(str);
  __dest = (char *)(*p_Var2)(sVar4 + 1);
  if (pvVar3 == (void *)0x0) {
    pvVar3 = *data;
  }
  else {
    *(void **)data = pvVar3;
    if (__dest != (char *)0x0) {
      strcpy(__dest,str);
      uVar1 = *(uint *)((long)data + 8);
      *(char **)(*data + (ulong)uVar1 * 8) = __dest;
      *(uint *)((long)data + 8) = uVar1 + 1;
      return;
    }
  }
  *(undefined4 *)((long)data + 0xc) = 2;
  *(undefined8 *)((long)pvVar3 + (ulong)*(uint *)((long)data + 8) * 8) = 0;
  PHYSFS_freeList(*data);
  return;
}

Assistant:

static void enumStringListCallback(void *data, const char *str)
{
    void *ptr;
    char *newstr;
    EnumStringListCallbackData *pecd = (EnumStringListCallbackData *) data;

    if (pecd->errcode)
        return;

    ptr = allocator.Realloc(pecd->list, (pecd->size + 2) * sizeof (char *));
    newstr = (char *) allocator.Malloc(strlen(str) + 1);
    if (ptr != NULL)
        pecd->list = (char **) ptr;

    if ((ptr == NULL) || (newstr == NULL))
    {
        pecd->errcode = PHYSFS_ERR_OUT_OF_MEMORY;
        pecd->list[pecd->size] = NULL;
        PHYSFS_freeList(pecd->list);
        return;
    } /* if */

    strcpy(newstr, str);
    pecd->list[pecd->size] = newstr;
    pecd->size++;
}